

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O0

void envy_bios_parse_L_unk0(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_L_unk0 *peVar5;
  envy_bios_L_unk0_entry *peVar6;
  envy_bios_L_unk0_entry *e;
  int i;
  int err;
  envy_bios_L_unk0 *unk0;
  envy_bios *bios_local;
  
  peVar5 = &(bios->L).unk0;
  if (peVar5->offset != 0) {
    bios_u8(bios,(uint)peVar5->offset,&(bios->L).unk0.version);
    uVar1 = (bios->L).unk0.version;
    if ((uVar1 == '0') || (uVar1 == '@')) {
      iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->L).unk0.hlen);
      iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->L).unk0.rlen);
      iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->L).unk0.entriesnum);
      (bios->L).unk0.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      peVar6 = (envy_bios_L_unk0_entry *)malloc((ulong)(bios->L).unk0.entriesnum << 1);
      (bios->L).unk0.entries = peVar6;
      for (e._0_4_ = 0; (int)e < (int)(uint)(bios->L).unk0.entriesnum; e._0_4_ = (int)e + 1) {
        (bios->L).unk0.entries[(int)e].offset =
             peVar5->offset + (ushort)(bios->L).unk0.hlen +
             (short)(int)e * (ushort)(bios->L).unk0.rlen;
      }
    }
    else {
      fprintf(_stderr,"Unknown L UNK0 table version 0x%x\n",(ulong)(bios->L).unk0.version);
    }
  }
  return;
}

Assistant:

static void
envy_bios_parse_L_unk0(struct envy_bios *bios)
{
	struct envy_bios_L_unk0 *unk0 = &bios->L.unk0;
	int err = 0, i;

	if (!unk0->offset)
		return;

	bios_u8(bios, unk0->offset, &unk0->version);
	switch (unk0->version) {
	case 0x30:
	case 0x40:
		err |= bios_u8(bios, unk0->offset + 0x1, &unk0->hlen);
		err |= bios_u8(bios, unk0->offset + 0x2, &unk0->rlen);
		err |= bios_u8(bios, unk0->offset + 0x3, &unk0->entriesnum);
		unk0->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown L UNK0 table version 0x%x\n", unk0->version);
		return;
	}

	unk0->entries = malloc(unk0->entriesnum * sizeof(struct envy_bios_L_unk0_entry));
	for (i = 0; i < unk0->entriesnum; ++i) {
		struct envy_bios_L_unk0_entry *e = &unk0->entries[i];
		e->offset = unk0->offset + unk0->hlen + i * unk0->rlen;
	}
}